

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall iu_Matcher_x_iutest_x_Each_Test::Body(iu_Matcher_x_iutest_x_Each_Test *this)

{
  vector<int,_std::allocator<int>_> *v;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *v_00;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  string local_240;
  string local_220;
  AssertionResult local_200;
  iuCodeMessage local_1d8;
  undefined1 local_1a8 [16];
  iuCodeMessage *local_198;
  iuCodeMessage *local_190;
  
  local_1a8._0_8_ = &PTR__IMatcher_00225e68;
  local_1a8._8_4_ = 1;
  iutest::detail::EachMatcher<int>::operator()
            (&local_200,(EachMatcher<int> *)local_1a8,(int (*) [3])(anonymous_namespace)::gc);
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::PrintToString<int[3]>(&local_240,(int (*) [3])(anonymous_namespace)::gc);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_220,(detail *)local_240._M_dataplus._M_p,"Each(1)",(char *)&local_200,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x123,local_220._M_dataplus._M_p);
    local_1d8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_200);
  local_1d8.m_message._M_dataplus._M_p._0_4_ = 10;
  local_1a8._0_8_ = &PTR__EachMatcher_00225ea8;
  local_1a8._8_8_ = &PTR__IMatcher_00224780;
  local_198 = &local_1d8;
  iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>::operator()
            (&local_200,(EachMatcher<iutest::detail::LeMatcher<int>> *)local_1a8,
             (vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::va);
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::PrintToString<std::vector<int,std::allocator<int>>>
              (&local_240,(iutest *)&(anonymous_namespace)::va,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_220,(detail *)local_240._M_dataplus._M_p,"Each(Le(10))",(char *)&local_200,
               in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x124,local_220._M_dataplus._M_p);
    local_1d8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_200);
  local_1d8.m_message._M_dataplus._M_p._0_4_ = 10;
  local_1a8._0_8_ = &PTR__EachMatcher_00225ee8;
  local_1a8._8_8_ = &PTR__EachMatcher_00225ea8;
  local_198 = (iuCodeMessage *)&PTR__IMatcher_00224780;
  local_190 = &local_1d8;
  iutest::detail::EachMatcher<iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>>::
  operator()(&local_200,
             (EachMatcher<iutest::detail::EachMatcher<iutest::detail::LeMatcher<int>>> *)local_1a8,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)(anonymous_namespace)::vv);
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::
    PrintToString<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
              (&local_240,(iutest *)(anonymous_namespace)::vv,v_00);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_220,(detail *)local_240._M_dataplus._M_p,"Each(Each(Le(10)))",
               (char *)&local_200,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x125,local_220._M_dataplus._M_p);
    local_1d8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,(Fixed *)local_1a8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_200);
  return;
}

Assistant:

IUTEST(MatcherFailure, At)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(gb, At(2, 2)), "At 2: 2" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(va, At(1, Gt(1))), "At 1: Gt: 1" );
}